

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::RecordSet::SetRecordValues
          (RecordSet *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *RV,KUINT16 RecCnt)

{
  pointer *ppuVar1;
  ushort uVar2;
  iterator __position;
  ulong in_RAX;
  ushort uVar3;
  KUINT8 ui8Pad;
  undefined8 uStack_28;
  
  this->m_ui16RecCnt = RecCnt;
  uStack_28 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_vui8RecVals,RV);
  uVar2 = this->m_ui16RecLen;
  uStack_28 = uStack_28 & 0xffffffffffffff;
  uVar3 = uVar2 & 3;
  if (uVar3 != 0) {
    do {
      __position._M_current =
           (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8RecVals,
                   __position,(uchar *)((long)&uStack_28 + 7));
      }
      else {
        *__position._M_current = uStack_28._7_1_;
        ppuVar1 = &(this->m_vui8RecVals).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar2 = this->m_ui16RecLen;
  }
  this->m_ui16RecLen =
       uVar2 + ((short)*(undefined4 *)
                        &(this->m_vui8RecVals).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
               (short)*(undefined4 *)
                       &(this->m_vui8RecVals).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) + 0xc;
  return;
}

Assistant:

void RecordSet::SetRecordValues( const vector<KUINT8> & RV, KUINT16 RecCnt )
{
    m_ui16RecCnt = RecCnt;
    m_vui8RecVals = RV;

    // Calculate padding to a 32 bit boundary.
    KUINT8 ui8NumPadding = m_ui16RecLen % 4;

    // Add the padding
    KUINT8 ui8Pad = 0;

    for( KUINT8 i = 0; i < ui8NumPadding; ++i )
    {
        m_vui8RecVals.push_back( ui8Pad );
    }

    m_ui16RecLen += RECORD_SET_SIZE + m_vui8RecVals.size();
}